

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_mem_legacy.c
# Opt level: O0

RK_S32 commit_memory_handle(vpu_display_mem_pool *p,RK_S32 mem_hdl,RK_S32 size)

{
  vpu_display_mem_pool_impl *p_mempool;
  MppBufferInfo info;
  RK_S32 size_local;
  RK_S32 mem_hdl_local;
  vpu_display_mem_pool *p_local;
  
  info.fd = size;
  info.index = mem_hdl;
  if ((vpu_mem_debug & 1) != 0) {
    _mpp_log_l(4,0,"in  pool %p hnl %p size %d\n","commit_memory_handle",p,mem_hdl,size);
  }
  memset(&p_mempool,0,0x28);
  p_mempool._0_4_ = 1;
  info.hnd._0_4_ = info.index;
  info._0_8_ = SEXT48((int)(info.fd & 0x7ffffff));
  info.hnd._4_4_ = (uint)info.fd >> 0x1b;
  *(int *)&p[1].get_free = info.fd;
  p->buff_size = info.fd;
  mpp_buffer_import_with_tag(p[1].commit_hdl,&p_mempool,0,0,"commit_memory_handle");
  if ((vpu_mem_debug & 1) != 0) {
    _mpp_log_l(4,0,"out pool %p fd %d\n","commit_memory_handle",p,(RK_S32)info.hnd);
  }
  return (RK_S32)info.hnd;
}

Assistant:

static RK_S32
commit_memory_handle(vpu_display_mem_pool *p, RK_S32 mem_hdl, RK_S32 size)
{
    MppBufferInfo info;
    vpu_display_mem_pool_impl *p_mempool = (vpu_display_mem_pool_impl *)p;

    vpu_mem_dbg_func("in  pool %p hnl %p size %d\n", p, mem_hdl, size);
    memset(&info, 0, sizeof(MppBufferInfo));
    info.type = MPP_BUFFER_TYPE_ION;
    info.fd = mem_hdl;
    info.size = size & 0x07ffffff;
    info.index = (size & 0xf8000000) >> 27;

    p_mempool->size = size;
    p_mempool->buff_size = size;

    mpp_buffer_commit(p_mempool->group, &info);
    vpu_mem_dbg_func("out pool %p fd %d\n", p, info.fd);
    return info.fd;
}